

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O0

void __thiscall QXcbEglIntegration::QXcbEglIntegration(QXcbEglIntegration *this)

{
  bool bVar1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffffa8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *file;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QDebug *in_stack_ffffffffffffffc8;
  QDebug local_20 [8];
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  QXcbGlIntegration::QXcbGlIntegration((QXcbGlIntegration *)in_RDI);
  QNativeInterface::Private::QEGLIntegration::QEGLIntegration((QEGLIntegration *)&in_RDI->control);
  in_RDI->category = (QLoggingCategory *)&PTR__QXcbEglIntegration_00111140;
  *(undefined ***)&in_RDI->control = &PTR__QXcbEglIntegration_001111a8;
  in_RDI[1].category = (QLoggingCategory *)0x0;
  *(undefined8 *)&in_RDI[1].control = 0;
  *(undefined1 *)&in_RDI[2].category = 0;
  QScopedPointer<QXcbEglNativeInterfaceHandler,_QScopedPointerDeleter<QXcbEglNativeInterfaceHandler>_>
  ::QScopedPointer((QScopedPointer<QXcbEglNativeInterfaceHandler,_QScopedPointerDeleter<QXcbEglNativeInterfaceHandler>_>
                    *)&in_RDI[2].control,(QXcbEglNativeInterfaceHandler *)0x0);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcQpaGl();
  anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_RDI,in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1252d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x107d6f);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffc0,(char *)file,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffffa8,(char *)0x107d85);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffffc8,t);
    QDebug::~QDebug(local_20);
    local_10 = 0;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXcbEglIntegration::QXcbEglIntegration()
    : m_connection(nullptr)
    , m_egl_display(EGL_NO_DISPLAY)
    , m_using_platform_display(false)
{
    qCDebug(lcQpaGl) << "Xcb EGL gl-integration created";
}